

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPrerequisiteTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles2::Functional::StateResetCase::iterate(StateResetCase *this)

{
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  TestError *e;
  StateResetCase *this_local;
  
  renderCtx = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  ctxInfo = gles2::Context::getContextInfo((this->super_TestCase).m_context);
  glu::resetState(renderCtx,ctxInfo);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

TestCase::IterateResult StateResetCase::iterate (void)
{
	try
	{
		glu::resetState(m_context.getRenderContext(), m_context.getContextInfo());
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (const tcu::TestError& e)
	{
		m_testCtx.getLog() << e;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return TestCase::STOP;
}